

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraClau.c
# Opt level: O1

int Fra_ClauCheckProperty(Cla_Man_t *p,Vec_Int_t *vCex)

{
  sat_solver *s;
  uint *puVar1;
  int iVar2;
  Vec_Int_t *pVVar3;
  long lVar4;
  int iVar5;
  
  s = p->pSatMain;
  if (0 < s->size) {
    puVar1 = s->activity;
    lVar4 = 0;
    do {
      puVar1[lVar4] = 0;
      lVar4 = lVar4 + 1;
    } while (lVar4 < s->size);
  }
  s->var_inc = 1;
  iVar2 = sat_solver_solve(s,(lit *)0x0,(lit *)0x0,0,0,0,0);
  vCex->nSize = 0;
  iVar5 = 1;
  if (iVar2 != -1) {
    if (iVar2 != 1) {
      __assert_fail("RetValue == l_True",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraClau.c"
                    ,0x162,"int Fra_ClauCheckProperty(Cla_Man_t *, Vec_Int_t *)");
    }
    pVVar3 = p->vSatVarsMainCs;
    if (pVVar3->nSize < 1) {
      iVar5 = 0;
    }
    else {
      iVar5 = 0;
      lVar4 = 0;
      do {
        iVar2 = sat_solver_var_literal(p->pSatMain,pVVar3->pArray[lVar4]);
        Vec_IntPush(vCex,iVar2);
        lVar4 = lVar4 + 1;
        pVVar3 = p->vSatVarsMainCs;
      } while (lVar4 < pVVar3->nSize);
    }
  }
  return iVar5;
}

Assistant:

int Fra_ClauCheckProperty( Cla_Man_t * p, Vec_Int_t * vCex )
{
    int nBTLimit = 0;
    int RetValue, iVar, i;
    sat_solver_act_var_clear( p->pSatMain );
    RetValue = sat_solver_solve( p->pSatMain, NULL, NULL, (ABC_INT64_T)nBTLimit, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
    Vec_IntClear( vCex );
    if ( RetValue == l_False )
        return 1;
    assert( RetValue == l_True );
    Vec_IntForEachEntry( p->vSatVarsMainCs, iVar, i )
        Vec_IntPush( vCex, sat_solver_var_literal(p->pSatMain, iVar) );
/*
    {
        int i;
        for (i = 0; i < p->pSatMain->size; i++)
            printf( "%d=%d ", i, p->pSatMain->model.ptr[i] == l_True );
        printf( "\n" );
    }
*/
    return 0;
}